

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::PrintState(BaseTag *this,State *s,ostream *out)

{
  int iVar1;
  int iVar2;
  int y;
  int iVar3;
  char *pcVar4;
  int x;
  int x_00;
  
  iVar1 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[*(int *)(s + 0xc)];
  iVar2 = (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[*(int *)(s + 0xc)];
  y = despot::Floor::num_rows();
  while (0 < y) {
    y = y + -1;
    x_00 = 0;
    while( true ) {
      iVar3 = despot::Floor::num_cols();
      if (iVar3 <= x_00) break;
      iVar3 = Floor::GetIndex(&this->floor_,x_00,y);
      pcVar4 = "#";
      if ((iVar3 != (int)Floor::INVALID) && (pcVar4 = "Q", iVar3 != iVar2 || iVar3 != iVar1)) {
        pcVar4 = "O";
        if (iVar3 != iVar2) {
          pcVar4 = ".";
        }
        if (iVar3 == iVar1) {
          pcVar4 = "R";
        }
      }
      std::operator<<(out,pcVar4);
      x_00 = x_00 + 1;
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  return;
}

Assistant:

void BaseTag::PrintState(const State& s, ostream& out) const {
	const TagState& state = static_cast<const TagState&>(s);

	int aindex = rob_[state.state_id];
	int oindex = opp_[state.state_id];

	for (int y = floor_.num_rows()-1; y >= 0; y--) {
		for (int x = 0; x < floor_.num_cols(); x++) {
			int index = floor_.GetIndex(x, y);
			if (index == Floor::INVALID)
				out << "#";
			else if (index == aindex && index == oindex)
				out << "Q";
			else if (index == aindex)
				out << "R";
			else if (index == oindex)
				out << "O";
			else
				out << ".";
		}
		out << endl;
	}
}